

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

ostream * ClipperLib::operator<<(ostream *s,Paths *p)

{
  pointer pvVar1;
  size_type i;
  ulong uVar2;
  long lVar3;
  
  lVar3 = 0;
  for (uVar2 = 0;
      pvVar1 = (p->
               super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)(((long)(p->
                             super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18);
      uVar2 = uVar2 + 1) {
    operator<<(s,(Path *)((long)&(pvVar1->
                                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                 )._M_impl.super__Vector_impl_data + lVar3));
    lVar3 = lVar3 + 0x18;
  }
  std::operator<<(s,"\n");
  return s;
}

Assistant:

std::ostream& operator <<(std::ostream &s, const Paths &p)
{
  for (Paths::size_type i = 0; i < p.size(); i++)
    s << p[i];
  s << "\n";
  return s;
}